

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

int32_t __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::getDataBlock(MutableCodePointTrie *this,int32_t i)

{
  int iVar1;
  int32_t newBlock_1;
  int32_t iLimit;
  int32_t iStart;
  int32_t newBlock;
  int32_t i_local;
  MutableCodePointTrie *this_local;
  
  if (this->flags[i] == '\x01') {
    this_local._4_4_ = this->index[i];
  }
  else if (i < 0x1000) {
    iLimit = allocDataBlock(this,0x40);
    this_local._4_4_ = iLimit;
    if (-1 < iLimit) {
      newBlock_1 = i & 0xfffffffcU;
      do {
        writeBlock(this->data + iLimit,this->index[newBlock_1]);
        this->flags[newBlock_1] = '\x01';
        iVar1 = newBlock_1 + 1;
        this->index[newBlock_1] = iLimit;
        iLimit = iLimit + 0x10;
        newBlock_1 = iVar1;
      } while (iVar1 < (int)((i & 0xfffffffcU) + 4));
      this_local._4_4_ = this->index[i];
    }
  }
  else {
    this_local._4_4_ = allocDataBlock(this,0x10);
    if (-1 < (int)this_local._4_4_) {
      writeBlock(this->data + (int)this_local._4_4_,this->index[i]);
      this->flags[i] = '\x01';
      this->index[i] = this_local._4_4_;
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t MutableCodePointTrie::getDataBlock(int32_t i) {
    if (flags[i] == MIXED) {
        return index[i];
    }
    if (i < BMP_I_LIMIT) {
        int32_t newBlock = allocDataBlock(UCPTRIE_FAST_DATA_BLOCK_LENGTH);
        if (newBlock < 0) { return newBlock; }
        int32_t iStart = i & ~(SMALL_DATA_BLOCKS_PER_BMP_BLOCK -1);
        int32_t iLimit = iStart + SMALL_DATA_BLOCKS_PER_BMP_BLOCK;
        do {
            U_ASSERT(flags[iStart] == ALL_SAME);
            writeBlock(data + newBlock, index[iStart]);
            flags[iStart] = MIXED;
            index[iStart++] = newBlock;
            newBlock += UCPTRIE_SMALL_DATA_BLOCK_LENGTH;
        } while (iStart < iLimit);
        return index[i];
    } else {
        int32_t newBlock = allocDataBlock(UCPTRIE_SMALL_DATA_BLOCK_LENGTH);
        if (newBlock < 0) { return newBlock; }
        writeBlock(data + newBlock, index[i]);
        flags[i] = MIXED;
        index[i] = newBlock;
        return newBlock;
    }
}